

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O0

pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
* __thiscall
jessilib::
word_split_once<std::vector<char8_t,std::allocator<char8_t>>,__gnu_cxx::__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>>,__gnu_cxx::__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>>,char8_t>
          (pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> begin,
          __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> end,
          char8_t in_whitespace)

{
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  vector<char8_t,_std::allocator<char8_t>_> local_e0;
  char8_t *local_c8;
  char8_t *local_c0;
  vector<char8_t,_std::allocator<char8_t>_> local_b8;
  char8_t *local_90;
  char8_t *local_88;
  vector<char8_t,_std::allocator<char8_t>_> local_80;
  __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> local_68;
  __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> itr;
  undefined1 local_58 [8];
  pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
  result;
  __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> _Stack_20;
  char8_t in_whitespace_local;
  __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> end_local;
  __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> begin_local;
  
  result.second.super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = (char)end._M_current;
  _Stack_20._M_current = begin._M_current;
  end_local._M_current = (char8_t *)this;
  std::
  pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
  ::
  pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>,_true>
            ((pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
              *)local_58);
  itr._M_current._7_1_ =
       __gnu_cxx::operator<=><char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>>
                 (&end_local,&stack0xffffffffffffffe0);
  std::__cmp_cat::__unspec::__unspec((__unspec *)((long)&itr._M_current + 6),(__unspec *)0x0);
  bVar1 = std::operator>=(itr._M_current._7_1_);
  if (bVar1) {
    std::
    pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
    ::pair(__return_storage_ptr__,
           (pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
            *)local_58);
  }
  else {
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>
                        (&end_local,&stack0xffffffffffffffe0);
      bVar1 = false;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>
                 ::operator*(&end_local);
        bVar1 = *pcVar3 ==
                result.second.super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._7_1_;
      }
      if (!bVar1) break;
      __gnu_cxx::__normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>
      ::operator++(&end_local);
    }
    local_68._M_current = end_local._M_current;
    while (bVar1 = __gnu_cxx::
                   operator==<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>
                             (&local_68,&stack0xffffffffffffffe0), ((bVar1 ^ 0xffU) & 1) != 0) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>::
               operator*(&local_68);
      if (*pcVar3 ==
          result.second.super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_) {
        local_88 = end_local._M_current;
        local_90 = local_68._M_current;
        make_word_split_member<std::vector<char8_t,_std::allocator<char8_t>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>,_nullptr>
                  (&local_80,end_local,local_68);
        std::vector<char8_t,_std::allocator<char8_t>_>::operator=
                  ((vector<char8_t,_std::allocator<char8_t>_> *)local_58,&local_80);
        std::vector<char8_t,_std::allocator<char8_t>_>::~vector(&local_80);
        __gnu_cxx::
        __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>::
        operator++(&local_68);
        while( true ) {
          bVar2 = __gnu_cxx::
                  operator==<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>
                            (&local_68,&stack0xffffffffffffffe0);
          bVar1 = false;
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            pcVar3 = __gnu_cxx::
                     __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>
                     ::operator*(&local_68);
            bVar1 = *pcVar3 ==
                    result.second.super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._7_1_;
          }
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>::
          operator++(&local_68);
        }
        local_c0 = local_68._M_current;
        local_c8 = _Stack_20._M_current;
        make_word_split_member<std::vector<char8_t,_std::allocator<char8_t>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>,_nullptr>
                  (&local_b8,local_68,_Stack_20);
        std::vector<char8_t,_std::allocator<char8_t>_>::operator=
                  ((vector<char8_t,_std::allocator<char8_t>_> *)
                   &result.first.super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_b8);
        std::vector<char8_t,_std::allocator<char8_t>_>::~vector(&local_b8);
        std::
        pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
        ::pair(__return_storage_ptr__,
               (pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
                *)local_58);
        goto LAB_00605826;
      }
      __gnu_cxx::__normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>
      ::operator++(&local_68);
    }
    make_word_split_member<std::vector<char8_t,_std::allocator<char8_t>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>,_nullptr>
              (&local_e0,end_local,_Stack_20);
    std::vector<char8_t,_std::allocator<char8_t>_>::operator=
              ((vector<char8_t,_std::allocator<char8_t>_> *)local_58,&local_e0);
    std::vector<char8_t,_std::allocator<char8_t>_>::~vector(&local_e0);
    std::
    pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
    ::pair(__return_storage_ptr__,
           (pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
            *)local_58);
  }
LAB_00605826:
  itr._M_current._0_4_ = 1;
  std::
  pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
  ::~pair((pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
           *)local_58);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}